

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O3

int Omega_h::close(int __fd)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  long lVar6;
  pointer pPVar7;
  _Base_ptr p_Var8;
  bool bVar9;
  int extraout_EAX;
  NodeEdges *pNVar10;
  uint uVar11;
  ParserGraph *in_RCX;
  long lVar12;
  undefined8 uVar13;
  Grammar *in_RDX;
  _Base_ptr p_Var14;
  uint *puVar15;
  long *in_RSI;
  undefined4 in_register_0000003c;
  vector<int,std::allocator<int>> *pvVar16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  int config_i;
  queue<int,_std::deque<int,_std::allocator<int>_>_> config_q;
  set<int,_std::less<int>,_std::allocator<int>_> config_set;
  uint local_d4;
  char *local_d0;
  _Deque_base<int,_std::allocator<int>_> local_c8;
  vector<int,std::allocator<int>> *local_78;
  ParserGraph *local_70;
  long *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  pvVar16 = (vector<int,std::allocator<int>> *)CONCAT44(in_register_0000003c,__fd);
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_70 = in_RCX;
  local_68 = in_RSI;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_c8,0);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar15 = *(uint **)pvVar16;
  puVar5 = *(uint **)(pvVar16 + 8);
  local_78 = pvVar16;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (puVar15 != puVar5) {
    do {
      local_d4 = *puVar15;
      if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                  ((deque<int,std::allocator<int>> *)&local_c8,(int *)&local_d4);
      }
      else {
        *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_d4;
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var18 = &p_Var1->_M_header;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        do {
          p_Var17 = p_Var18;
          p_Var14 = p_Var8;
          _Var2 = p_Var14[1]._M_color;
          p_Var18 = p_Var14;
          if ((int)_Var2 < (int)local_d4) {
            p_Var18 = p_Var17;
          }
          p_Var8 = (&p_Var14->_M_left)[(int)_Var2 < (int)local_d4];
        } while ((&p_Var14->_M_left)[(int)_Var2 < (int)local_d4] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var18 != p_Var1) {
          if ((int)_Var2 < (int)local_d4) {
            p_Var14 = p_Var17;
          }
          if ((int)p_Var14[1]._M_color <= (int)local_d4) {
            fail("assertion %s failed at %s +%d\n","!config_set.count(config_i)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
                 ,0x45);
          }
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,(int *)&local_d4);
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar5);
  }
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_d0 = "0 <= i";
    do {
      uVar3 = *local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_c8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_c8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_c8._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)((uint *)local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80);
        local_c8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      if ((int)uVar3 < 0) {
        uVar13 = 0x1d;
LAB_00241670:
        fail("assertion %s failed at %s +%d\n",local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
             ,uVar13);
      }
      lVar6 = *local_68;
      if ((int)((ulong)(local_68[1] - lVar6) >> 3) <= (int)uVar3) {
        uVar13 = 0x1e;
        local_d0 = "i < int(v.size())";
        goto LAB_00241670;
      }
      iVar4 = *(int *)(lVar6 + (ulong)uVar3 * 8);
      lVar12 = (long)iVar4;
      if (lVar12 < 0) {
        uVar13 = 0x1d;
LAB_0024163e:
        fail("assertion %s failed at %s +%d\n",local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
             ,uVar13);
      }
      pPVar7 = (in_RDX->productions).
               super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(in_RDX->productions).
                              super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar7) >> 5) <=
          iVar4) {
        uVar13 = 0x1e;
        local_d0 = "i < int(v.size())";
        goto LAB_0024163e;
      }
      uVar3 = *(uint *)(lVar6 + 4 + (ulong)uVar3 * 8);
      lVar6 = *(long *)&pPVar7[lVar12].rhs.super__Vector_base<int,_std::allocator<int>_>._M_impl;
      uVar11 = (uint)((ulong)((long)*(pointer *)
                                     ((long)&pPVar7[lVar12].rhs.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                     8) - lVar6) >> 2);
      if (uVar3 != uVar11) {
        if ((int)uVar3 < 0) {
          uVar13 = 0x1d;
LAB_002416a2:
          fail("assertion %s failed at %s +%d\n",local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
               ,uVar13);
        }
        if ((int)uVar11 <= (int)uVar3) {
          uVar13 = 0x1e;
          local_d0 = "i < int(v.size())";
          goto LAB_002416a2;
        }
        iVar4 = *(int *)(lVar6 + (ulong)uVar3 * 4);
        bVar9 = is_terminal(in_RDX,iVar4);
        if (!bVar9) {
          pNVar10 = get_edges(local_70,iVar4);
          puVar5 = (uint *)(pNVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
          for (puVar15 = (uint *)(pNVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start; puVar15 != puVar5;
              puVar15 = puVar15 + 1) {
            local_d4 = *puVar15;
            p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var18 = &p_Var1->_M_header;
            if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_002415a6:
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_60,(int *)&local_d4);
              if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                          ((deque<int,std::allocator<int>> *)&local_c8,(int *)&local_d4);
              }
              else {
                *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_d4;
                local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
            }
            else {
              do {
                p_Var17 = p_Var18;
                p_Var14 = p_Var8;
                _Var2 = p_Var14[1]._M_color;
                p_Var18 = p_Var14;
                if ((int)_Var2 < (int)local_d4) {
                  p_Var18 = p_Var17;
                }
                p_Var8 = (&p_Var14->_M_left)[(int)_Var2 < (int)local_d4];
              } while ((&p_Var14->_M_left)[(int)_Var2 < (int)local_d4] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var18 == p_Var1) goto LAB_002415a6;
              if ((int)_Var2 < (int)local_d4) {
                p_Var14 = p_Var17;
              }
              if ((int)local_d4 < (int)p_Var14[1]._M_color) goto LAB_002415a6;
            }
          }
        }
      }
    } while (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::vector<int,std::allocator<int>>::_M_assign_aux<std::_Rb_tree_const_iterator<int>>
            (local_78,local_60._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_c8);
  return extraout_EAX;
}

Assistant:

static void close(StateInProgress& state, Configs const& cs,
    Grammar const& grammar, ParserGraph const& lhs2sc) {
  std::queue<int> config_q;
  std::set<int> config_set;
  for (auto config_i : state.configs) {
    config_q.push(config_i);
    OMEGA_H_CHECK(!config_set.count(config_i));
    config_set.insert(config_i);
  }
  while (!config_q.empty()) {
    auto config_i = config_q.front();
    config_q.pop();
    auto& config = at(cs, config_i);
    auto prod_i = config.production;
    auto& prod = at(grammar.productions, prod_i);
    if (config.dot == size(prod.rhs)) continue;
    auto symbol_after_dot = at(prod.rhs, config.dot);
    if (is_terminal(grammar, symbol_after_dot)) continue;
    for (auto sc : get_edges(lhs2sc, symbol_after_dot)) {
      if (!config_set.count(sc)) {
        config_set.insert(sc);
        config_q.push(sc);
      }
    }
  }
  state.configs.assign(config_set.begin(), config_set.end());
}